

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper.h
# Opt level: O2

int __thiscall spdlog::details::file_helper::open(file_helper *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int iVar2;
  spdlog_ex *this_00;
  int *piVar3;
  char *pcVar4;
  int iVar5;
  filename_t local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  close(this,(int)__file);
  pcVar4 = "ab";
  if (__oflag != 0) {
    pcVar4 = "wb";
  }
  std::__cxx11::string::_M_assign((string *)&this->_filename);
  iVar5 = 0;
  while( true ) {
    if (this->open_tries <= iVar5) {
      this_00 = (spdlog_ex *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_50,(string *)&this->_filename);
      std::operator+(&local_70,"Failed opening file ",&local_50);
      std::operator+(&local_90,&local_70," for writing");
      piVar3 = __errno_location();
      spdlog_ex::spdlog_ex(this_00,&local_90,*piVar3);
      __cxa_throw(this_00,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
    }
    std::__cxx11::string::string((string *)&local_90,pcVar4,(allocator *)&local_70);
    bVar1 = os::fopen_s(&this->fd_,(filename_t *)__file,&local_90);
    iVar2 = std::__cxx11::string::~string((string *)&local_90);
    if (!bVar1) break;
    os::sleep_for_millis(this->open_interval);
    iVar5 = iVar5 + 1;
  }
  return iVar2;
}

Assistant:

void open(const filename_t &fname, bool truncate = false)
    {
        close();
        auto *mode = truncate ? SPDLOG_FILENAME_T("wb") : SPDLOG_FILENAME_T("ab");
        _filename = fname;
        for (int tries = 0; tries < open_tries; ++tries)
        {
            if (!os::fopen_s(&fd_, fname, mode))
            {
                return;
            }

            details::os::sleep_for_millis(open_interval);
        }

        throw spdlog_ex("Failed opening file " + os::filename_to_str(_filename) + " for writing", errno);
    }